

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O2

void __thiscall denialofservice_tests::peer_discouragement::test_method(peer_discouragement *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  NetGroupManager *__args_3;
  Options opts;
  CService ipIn;
  CService ipIn_00;
  CService ipIn_01;
  CNode *pCVar1;
  char cVar2;
  bool bVar3;
  CChainParams *pCVar4;
  CNode *pCVar5;
  char *p2;
  long lVar6;
  ChainstateManager *pool;
  iterator pvVar7;
  CTxMemPool *warnings;
  iterator pvVar8;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  shared_ptr<Sock> sock;
  shared_ptr<Sock> sock_00;
  shared_ptr<Sock> sock_01;
  undefined4 uVar9;
  undefined4 uVar10;
  check_type cVar15;
  CAddress *pCVar11;
  undefined4 uVar12;
  uint uVar13;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffff8c4;
  undefined1 in_stack_fffffffffffff8c8;
  undefined7 in_stack_fffffffffffff8c9;
  CNodeOptions *in_stack_fffffffffffff8d0;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 local_5d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 local_3e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_3e0 [2];
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  allocator<char> local_309;
  undefined1 local_308 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_300 [2];
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined2 local_2c0;
  undefined2 uStack_2be;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined2 uStack_2b4;
  undefined2 uStack_2b2;
  undefined4 local_2b0;
  undefined1 local_2a8 [8];
  __single_object connman;
  __single_object banman;
  assertion_result local_290;
  _List local_278;
  undefined1 local_270;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock33;
  direct_or_indirect local_258 [2];
  direct_or_indirect local_238;
  pointer local_228;
  string *local_220;
  array<CNode_*,_3UL> nodes;
  CNetAddr other_addr;
  CService local_1c8;
  CService local_1a0;
  CService local_178;
  array<CAddress,_3UL> addr;
  CService tor_service;
  CNetAddr tor_netaddr;
  path local_60;
  BanMan *local_38;
  
  local_38 = *(BanMan **)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock33,&NetEventsInterface::g_msgproc_mutex,
             "NetEventsInterface::g_msgproc_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
             ,0x12d,false);
  ArgsManager::GetDataDirBase
            ((path *)&local_60,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
              super_BasicTestingSetup.m_args);
  fs::operator/((path *)&addr,(path *)&local_60,p2);
  local_238.indirect_contents.indirect = (char *)0x0;
  std::make_unique<BanMan,fs::path,decltype(nullptr),unsigned_int_const&>
            ((path *)&banman,(void **)&addr,(uint *)local_238.direct);
  std::filesystem::__cxx11::path::~path((path *)&addr);
  std::filesystem::__cxx11::path::~path(&local_60);
  addr._M_elems[0].super_CService.super_CNetAddr.m_addr._union._0_4_ = 0x1337;
  local_238._0_4_ = 0x1337;
  __args_3 = (NetGroupManager *)
             (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.addrman._M_t.
             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  pCVar4 = (CChainParams *)
           (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.netgroupman._M_t.
           super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>
           .super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl;
  Params();
  std::make_unique<ConnmanTestMsg,int,int,AddrMan&,NetGroupManager_const&,CChainParams_const&>
            ((int *)&connman,(int *)&addr,(AddrMan *)&local_238,__args_3,pCVar4);
  pool = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.super_BasicTestingSetup.
         m_node.chainman._M_t.
         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
         super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  warnings = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.mempool._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  local_2c0 = 0;
  uStack_2bc = 100;
  uStack_2b8 = 100;
  uStack_2b4 = 0;
  local_2b0 = 2000;
  uVar14 = 2000;
  _cVar15 = (check_type)((ulong)CONCAT42(100,uStack_2be) << 0x10);
  uVar12 = 100;
  uVar13 = (uint)(CONCAT26(uStack_2b2,100) >> 0x20);
  opts._8_8_ = (undefined8)_cVar15;
  opts._0_8_ = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
               super_BasicTestingSetup.m_node.warnings._M_t.
               super___uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>._M_t.
               super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
               super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl;
  opts.max_headers_result = 100;
  PeerManager::make((CConnman *)local_2a8,
                    (AddrMan *)
                    connman._M_t.
                    super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t
                    .super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
                    super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,
                    (BanMan *)
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.addrman._M_t.
                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                    (ChainstateManager *)
                    banman._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                    super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                    super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CTxMemPool *)pool,
                    (Warnings *)warnings,opts);
  CNetAddr::CNetAddr(&tor_netaddr);
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = (iterator)warnings;
  msg.m_begin = (iterator)pool;
  file.m_end = (iterator)0x135;
  file.m_begin = (iterator)&local_2d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2e0,msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr,"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion",
             (allocator<char> *)&other_addr);
  tor_service.super_CNetAddr.m_addr._union.direct[0] =
       CNetAddr::SetSpecial(&tor_netaddr,(string *)&addr);
  tor_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  tor_service.super_CNetAddr.m_addr._size = 0;
  tor_service.super_CNetAddr.m_addr._20_4_ = 0;
  local_290._0_8_ =
       "tor_netaddr.SetSpecial(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\")";
  local_290.m_message.px =
       (element_type *)
       ((long)
        "tor_netaddr.SetSpecial(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\")"
       + 0x58);
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_2e8 = "";
  uVar9 = 0;
  uVar10 = 0;
  local_220 = (string *)&local_290;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tor_service,(lazy_ostream *)&local_238,2,0,WARN,_cVar15,
             (size_t)&local_2f0,0x135);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&tor_service.super_CNetAddr.m_addr._size);
  std::__cxx11::string::~string((string *)addr._M_elems);
  pCVar4 = Params();
  CService::CService(&tor_service,&tor_netaddr,pCVar4->nDefaultPort);
  ip(&local_178,0xa0b0c001);
  ipIn.super_CNetAddr.m_addr._union._4_4_ = uVar10;
  ipIn.super_CNetAddr.m_addr._union._0_4_ = uVar9;
  ipIn.super_CNetAddr.m_addr._union._8_8_ = (undefined8)_cVar15;
  ipIn.super_CNetAddr.m_addr._size = uVar12;
  ipIn.super_CNetAddr.m_addr._20_4_ = uVar13;
  ipIn.super_CNetAddr.m_net = uVar14;
  ipIn.super_CNetAddr.m_scope_id = in_stack_fffffffffffff8c4;
  ipIn.port._0_1_ = in_stack_fffffffffffff8c8;
  ipIn._33_7_ = in_stack_fffffffffffff8c9;
  CAddress::CAddress(addr._M_elems,ipIn,(ServiceFlags)&local_178);
  this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(addr._M_elems + 1);
  ip(&local_1a0,0xa0b0c002);
  ipIn_00.super_CNetAddr.m_addr._union._4_4_ = uVar10;
  ipIn_00.super_CNetAddr.m_addr._union._0_4_ = uVar9;
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = (undefined8)_cVar15;
  ipIn_00.super_CNetAddr.m_addr._size = uVar12;
  ipIn_00.super_CNetAddr.m_addr._20_4_ = uVar13;
  ipIn_00.super_CNetAddr.m_net = uVar14;
  ipIn_00.super_CNetAddr.m_scope_id = in_stack_fffffffffffff8c4;
  ipIn_00.port._0_1_ = in_stack_fffffffffffff8c8;
  ipIn_00._33_7_ = in_stack_fffffffffffff8c9;
  CAddress::CAddress((CAddress *)this_00._M_pi,ipIn_00,(ServiceFlags)&local_1a0);
  CService::CService(&local_1c8,&tor_service);
  ipIn_01.super_CNetAddr.m_addr._union._4_4_ = uVar10;
  ipIn_01.super_CNetAddr.m_addr._union._0_4_ = uVar9;
  ipIn_01.super_CNetAddr.m_addr._union._8_8_ = (undefined8)_cVar15;
  ipIn_01.super_CNetAddr.m_addr._size = uVar12;
  ipIn_01.super_CNetAddr.m_addr._20_4_ = uVar13;
  ipIn_01.super_CNetAddr.m_net = uVar14;
  ipIn_01.super_CNetAddr.m_scope_id = in_stack_fffffffffffff8c4;
  ipIn_01.port._0_1_ = in_stack_fffffffffffff8c8;
  ipIn_01._33_7_ = in_stack_fffffffffffff8c9;
  CAddress::CAddress(addr._M_elems + 2,ipIn_01,(ServiceFlags)&local_1c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1a0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178);
  ip((CService *)&local_238,0xa0b0ff01);
  other_addr.m_addr._union._8_8_ = CONCAT71(local_238._9_7_,local_238.direct[8]);
  other_addr.m_addr._size = local_228._0_4_;
  local_228 = (pointer)((ulong)local_228 & 0xffffffff00000000);
  other_addr.m_addr._union.indirect_contents.indirect = local_238.indirect_contents.indirect;
  other_addr._24_8_ = local_220;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_238);
  BanMan::ClearBanned((BanMan *)
                      banman._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                      super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                      super__Head_base<0UL,_BanMan_*,_false>._M_head_impl);
  pCVar5 = (CNode *)operator_new(0x3a8);
  local_308 = (undefined1  [8])0x0;
  a_Stack_300[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CAddress::CAddress((CAddress *)&local_238);
  pCVar11 = (CAddress *)local_258;
  std::__cxx11::string::string<std::allocator<char>>((string *)pCVar11,"",&local_309);
  local_290._0_8_ = local_290._0_8_ & 0xffffffff00000000;
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = local_290.m_message.pn.pi_ & 0xffffffffffffff00;
  local_278._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x4c4b40;
  local_270 = 0;
  pvVar7 = (iterator)0x0;
  pvVar8 = (iterator)0x0;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&addr;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_308;
  CNode::CNode(pCVar5,0,sock,(CAddress *)0x0,0,(uint64_t)&local_238,pCVar11,
               (string *)((ulong)uVar13 << 0x20),INBOUND,SUB81(&local_290,0),
               in_stack_fffffffffffff8d0);
  nodes._M_elems[0] = pCVar5;
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             &local_290.m_message);
  std::__cxx11::string::~string((string *)local_258);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_300);
  pCVar1 = nodes._M_elems[0];
  LOCK();
  (pCVar5->m_greatest_common_version).super___atomic_base<int>._M_i = 0x11180;
  UNLOCK();
  (*(code *)**(undefined8 **)((long)local_2a8 + 8))
            ((long *)((long)local_2a8 + 8),nodes._M_elems[0],1);
  LOCK();
  (pCVar1->fSuccessfullyConnected)._M_base._M_i = true;
  UNLOCK();
  ConnmanTestMsg::AddTestNode
            ((ConnmanTestMsg *)
             connman._M_t.
             super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t.
             super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
             super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,pCVar1);
  (**(code **)(*(long *)local_2a8 + 0x98))(local_2a8,pCVar1->id);
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  file_00.m_end = (iterator)0x150;
  file_00.m_begin = (iterator)&local_320;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_330,
             msg_00);
  cVar2 = (**(code **)(*(long *)((long)local_2a8 + 8) + 0x20))((long *)((long)local_2a8 + 8),pCVar1)
  ;
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "peerLogic->SendMessages(nodes[0])";
  local_258[0]._8_8_ = (long)"peerLogic->SendMessages(nodes[0])" + 0x21;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_338 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)cVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_340,
             0x150);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  file_01.m_end = (iterator)0x152;
  file_01.m_begin = (iterator)&local_350;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_360,
             msg_01);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       BanMan::IsDiscouraged
                 ((BanMan *)
                  banman._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CNetAddr *)&addr);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "banman->IsDiscouraged(addr[0])";
  local_258[0]._8_8_ = (long)"banman->IsDiscouraged(addr[0])" + 0x1e;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_368 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_370,
             0x152);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  file_02.m_end = (iterator)0x153;
  file_02.m_begin = (iterator)&local_380;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_390,
             msg_02);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((pCVar1->fDisconnect)._M_base._M_i & 1);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "nodes[0]->fDisconnect";
  local_258[0]._8_8_ = (long)"nodes[0]->fDisconnect" + 0x15;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_398 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_3a0,
             0x153);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  file_03.m_end = (iterator)0x154;
  file_03.m_begin = (iterator)&local_3b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3c0,
             msg_03);
  bVar3 = BanMan::IsDiscouraged
                    ((BanMan *)
                     banman._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                     super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                     super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,&other_addr);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "!banman->IsDiscouraged(other_addr)";
  local_258[0]._8_8_ = (long)"!banman->IsDiscouraged(other_addr)" + 0x22;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_3c8 = "";
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_3d0,
             0x154);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  pCVar5 = (CNode *)operator_new(0x3a8);
  local_3e8 = (undefined1  [8])0x0;
  a_Stack_3e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CAddress::CAddress((CAddress *)&local_238);
  pCVar11 = (CAddress *)local_258;
  std::__cxx11::string::string<std::allocator<char>>((string *)pCVar11,"",&local_309);
  local_290._0_8_ = local_290._0_8_ & 0xffffffff00000000;
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = local_290.m_message.pn.pi_ & 0xffffffffffffff00;
  local_278._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x4c4b40;
  local_270 = 0;
  pvVar7 = &DAT_00000001;
  sock_00.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00._M_pi;
  sock_00.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_3e8;
  pvVar8 = pvVar7;
  CNode::CNode(pCVar5,1,sock_00,(CAddress *)&DAT_00000001,1,(uint64_t)&local_238,pCVar11,
               (string *)((ulong)uVar13 << 0x20),INBOUND,SUB81(&local_290,0),
               in_stack_fffffffffffff8d0);
  nodes._M_elems[1] = pCVar5;
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             &local_290.m_message);
  std::__cxx11::string::~string((string *)local_258);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_3e0);
  pCVar1 = nodes._M_elems[1];
  LOCK();
  (pCVar5->m_greatest_common_version).super___atomic_base<int>._M_i = 0x11180;
  UNLOCK();
  (*(code *)**(undefined8 **)((long)local_2a8 + 8))
            ((long *)((long)local_2a8 + 8),nodes._M_elems[1],1);
  LOCK();
  (pCVar1->fSuccessfullyConnected)._M_base._M_i = true;
  UNLOCK();
  ConnmanTestMsg::AddTestNode
            ((ConnmanTestMsg *)
             connman._M_t.
             super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t.
             super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
             super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,pCVar1);
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  file_04.m_end = (iterator)0x163;
  file_04.m_begin = (iterator)&local_3f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_408,
             msg_04);
  cVar2 = (**(code **)(*(long *)((long)local_2a8 + 8) + 0x20))((long *)((long)local_2a8 + 8),pCVar1)
  ;
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "peerLogic->SendMessages(nodes[1])";
  local_258[0]._8_8_ = (long)"peerLogic->SendMessages(nodes[1])" + 0x21;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_410 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)cVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_418,
             0x163);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  file_05.m_end = (iterator)0x165;
  file_05.m_begin = (iterator)&local_428;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_438,
             msg_05);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       BanMan::IsDiscouraged
                 ((BanMan *)
                  banman._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CNetAddr *)&addr);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "banman->IsDiscouraged(addr[0])";
  local_258[0]._8_8_ = (long)"banman->IsDiscouraged(addr[0])" + 0x1e;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_440 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_448,
             0x165);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  file_06.m_end = (iterator)0x166;
  file_06.m_begin = (iterator)&local_458;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_468,
             msg_06);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((nodes._M_elems[0]->fDisconnect)._M_base._M_i & 1);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "nodes[0]->fDisconnect";
  local_258[0]._8_8_ = (long)"nodes[0]->fDisconnect" + 0x15;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_470 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_478,
             0x166);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  file_07.m_end = (iterator)0x168;
  file_07.m_begin = (iterator)&local_488;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_498,
             msg_07);
  bVar3 = BanMan::IsDiscouraged
                    ((BanMan *)
                     banman._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                     super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                     super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CNetAddr *)this_00._M_pi);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar3;
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "!banman->IsDiscouraged(addr[1])";
  local_258[0]._8_8_ = (long)"!banman->IsDiscouraged(addr[1])" + 0x1f;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_4a0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_4a8,
             0x168);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  file_08.m_end = (iterator)0x169;
  file_08.m_begin = (iterator)&local_4b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4c8,
             msg_08);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(~(nodes._M_elems[1]->fDisconnect)._M_base._M_i & 1);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "!nodes[1]->fDisconnect";
  local_258[0]._8_8_ = (long)"!nodes[1]->fDisconnect" + 0x16;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_4d0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_4d8,
             0x169);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  pCVar1 = nodes._M_elems[1];
  (**(code **)(*(long *)local_2a8 + 0x98))(local_2a8,nodes._M_elems[1]->id);
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  file_09.m_end = (iterator)0x16b;
  file_09.m_begin = (iterator)&local_4e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4f8,
             msg_09);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (**(code **)(*(long *)((long)local_2a8 + 8) + 0x20))((long *)((long)local_2a8 + 8),pCVar1);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "peerLogic->SendMessages(nodes[1])";
  local_258[0]._8_8_ = (long)"peerLogic->SendMessages(nodes[1])" + 0x21;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_500 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_508,
             0x16b);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  file_10.m_end = (iterator)0x16d;
  file_10.m_begin = (iterator)&local_518;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_528,
             msg_10);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       BanMan::IsDiscouraged
                 ((BanMan *)
                  banman._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CNetAddr *)&addr);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "banman->IsDiscouraged(addr[0])";
  local_258[0]._8_8_ = (long)"banman->IsDiscouraged(addr[0])" + 0x1e;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_530 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_538,
             0x16d);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar7;
  file_11.m_end = (iterator)0x16e;
  file_11.m_begin = (iterator)&local_548;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_558,
             msg_11);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((nodes._M_elems[0]->fDisconnect)._M_base._M_i & 1);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "nodes[0]->fDisconnect";
  local_258[0]._8_8_ = (long)"nodes[0]->fDisconnect" + 0x15;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_560 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_568,
             0x16e);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar7;
  file_12.m_end = (iterator)0x16f;
  file_12.m_begin = (iterator)&local_578;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_588,
             msg_12);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       BanMan::IsDiscouraged
                 ((BanMan *)
                  banman._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CNetAddr *)this_00._M_pi);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "banman->IsDiscouraged(addr[1])";
  local_258[0]._8_8_ = (long)"!banman->IsDiscouraged(addr[1])" + 0x1f;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_590 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_598,
             0x16f);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar8;
  msg_13.m_begin = pvVar7;
  file_13.m_end = (iterator)0x170;
  file_13.m_begin = (iterator)&local_5a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_5b8,
             msg_13);
  local_290._0_8_ =
       CONCAT71(local_290._1_7_,(nodes._M_elems[1]->fDisconnect)._M_base._M_i) & 0xffffffffffffff01;
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "nodes[1]->fDisconnect";
  local_258[0]._8_8_ = (long)"!nodes[1]->fDisconnect" + 0x16;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_5c0 = "";
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_5c8,
             0x170);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  pCVar5 = (CNode *)operator_new(0x3a8);
  local_5d8 = (undefined1  [8])0x0;
  _Stack_5d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CAddress::CAddress((CAddress *)&local_238);
  pCVar11 = (CAddress *)local_258;
  std::__cxx11::string::string<std::allocator<char>>((string *)pCVar11,"",&local_309);
  local_290._0_8_ = local_290._0_8_ & 0xffffffff00000000;
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = local_290.m_message.pn.pi_ & 0xffffffffffffff00;
  local_278._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x4c4b40;
  local_270 = 0;
  pvVar7 = &DAT_00000001;
  sock_01.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(addr._M_elems + 2);
  sock_01.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_5d8;
  pvVar8 = pvVar7;
  CNode::CNode(pCVar5,2,sock_01,(CAddress *)&DAT_00000001,1,(uint64_t)&local_238,pCVar11,
               (string *)CONCAT44(uVar13,1),INBOUND,SUB81(&local_290,0),in_stack_fffffffffffff8d0);
  nodes._M_elems[2] = pCVar5;
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             &local_290.m_message);
  std::__cxx11::string::~string((string *)local_258);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_5d0);
  pCVar1 = nodes._M_elems[2];
  LOCK();
  (pCVar5->m_greatest_common_version).super___atomic_base<int>._M_i = 0x11180;
  UNLOCK();
  (*(code *)**(undefined8 **)((long)local_2a8 + 8))
            ((long *)((long)local_2a8 + 8),nodes._M_elems[2],1);
  LOCK();
  (pCVar1->fSuccessfullyConnected)._M_base._M_i = true;
  UNLOCK();
  ConnmanTestMsg::AddTestNode
            ((ConnmanTestMsg *)
             connman._M_t.
             super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t.
             super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
             super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,pCVar1);
  (**(code **)(*(long *)local_2a8 + 0x98))(local_2a8,pCVar1->id);
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar8;
  msg_14.m_begin = pvVar7;
  file_14.m_end = (iterator)0x182;
  file_14.m_begin = (iterator)&local_5e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5f8,
             msg_14);
  cVar2 = (**(code **)(*(long *)((long)local_2a8 + 8) + 0x20))((long *)((long)local_2a8 + 8),pCVar1)
  ;
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "peerLogic->SendMessages(nodes[2])";
  local_258[0]._8_8_ = (long)"peerLogic->SendMessages(nodes[2])" + 0x21;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_600 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)cVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_608,
             0x182);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar8;
  msg_15.m_begin = pvVar7;
  file_15.m_end = (iterator)0x183;
  file_15.m_begin = (iterator)&local_618;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_628,
             msg_15);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       BanMan::IsDiscouraged
                 ((BanMan *)
                  banman._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CNetAddr *)&addr);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "banman->IsDiscouraged(addr[0])";
  local_258[0]._8_8_ = (long)"banman->IsDiscouraged(addr[0])" + 0x1e;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_630 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_638,
             0x183);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar8;
  msg_16.m_begin = pvVar7;
  file_16.m_end = (iterator)0x184;
  file_16.m_begin = (iterator)&local_648;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_658,
             msg_16);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       BanMan::IsDiscouraged
                 ((BanMan *)
                  banman._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CNetAddr *)this_00._M_pi);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "banman->IsDiscouraged(addr[1])";
  local_258[0]._8_8_ = (long)"!banman->IsDiscouraged(addr[1])" + 0x1f;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_660 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_668,
             0x184);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pvVar8;
  msg_17.m_begin = pvVar7;
  file_17.m_end = (iterator)0x185;
  file_17.m_begin = (iterator)&local_678;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_688,
             msg_17);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       BanMan::IsDiscouraged
                 ((BanMan *)
                  banman._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,
                  (CNetAddr *)(addr._M_elems + 2));
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "banman->IsDiscouraged(addr[2])";
  local_258[0]._8_8_ = (long)"banman->IsDiscouraged(addr[2])" + 0x1e;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_690 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_698,
             0x185);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pvVar8;
  msg_18.m_begin = pvVar7;
  file_18.m_end = (iterator)0x186;
  file_18.m_begin = (iterator)&local_6a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_6b8,
             msg_18);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((nodes._M_elems[0]->fDisconnect)._M_base._M_i & 1);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "nodes[0]->fDisconnect";
  local_258[0]._8_8_ = (long)"nodes[0]->fDisconnect" + 0x15;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_6c0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_6c8,
             0x186);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar8;
  msg_19.m_begin = pvVar7;
  file_19.m_end = (iterator)0x187;
  file_19.m_begin = (iterator)&local_6d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_6e8,
             msg_19);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((nodes._M_elems[1]->fDisconnect)._M_base._M_i & 1);
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "nodes[1]->fDisconnect";
  local_258[0]._8_8_ = (long)"!nodes[1]->fDisconnect" + 0x16;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_6f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_6f0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_6f8,
             0x187);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar8;
  msg_20.m_begin = pvVar7;
  file_20.m_end = (iterator)0x188;
  file_20.m_begin = (iterator)&local_708;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_718,
             msg_20);
  local_290._0_8_ =
       CONCAT71(local_290._1_7_,(nodes._M_elems[2]->fDisconnect)._M_base._M_i) & 0xffffffffffffff01;
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258[0].indirect_contents.indirect = "nodes[2]->fDisconnect";
  local_258[0]._8_8_ = (long)"nodes[2]->fDisconnect" + 0x15;
  local_238.direct[8] = false;
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_0113a070;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_720 = "";
  local_220 = (string *)local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)&local_238,1,0,WARN,(check_type)pCVar11,(size_t)&local_728,
             0x188);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 8) {
    (**(code **)(*(long *)((long)local_2a8 + 8) + 8))
              ((long *)((long)local_2a8 + 8),*(undefined8 *)((long)nodes._M_elems + lVar6));
  }
  ConnmanTestMsg::ClearTestNodes
            ((ConnmanTestMsg *)
             connman._M_t.
             super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t.
             super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
             super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&other_addr.m_addr);
  std::array<CAddress,_3UL>::~array(&addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&tor_service);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&tor_netaddr.m_addr);
  if (local_2a8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_2a8 + 0x58))();
  }
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::~unique_ptr(&connman);
  std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::~unique_ptr(&banman);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock33.super_unique_lock);
  if (*(BanMan **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(peer_discouragement)
{
    LOCK(NetEventsInterface::g_msgproc_mutex);

    auto banman = std::make_unique<BanMan>(m_args.GetDataDirBase() / "banlist", nullptr, DEFAULT_MISBEHAVING_BANTIME);
    auto connman = std::make_unique<ConnmanTestMsg>(0x1337, 0x1337, *m_node.addrman, *m_node.netgroupman, Params());
    auto peerLogic = PeerManager::make(*connman, *m_node.addrman, banman.get(), *m_node.chainman, *m_node.mempool, *m_node.warnings, {});

    CNetAddr tor_netaddr;
    BOOST_REQUIRE(
        tor_netaddr.SetSpecial("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion"));
    const CService tor_service{tor_netaddr, Params().GetDefaultPort()};

    const std::array<CAddress, 3> addr{CAddress{ip(0xa0b0c001), NODE_NONE},
                                       CAddress{ip(0xa0b0c002), NODE_NONE},
                                       CAddress{tor_service, NODE_NONE}};

    const CNetAddr other_addr{ip(0xa0b0ff01)}; // Not any of addr[].

    std::array<CNode*, 3> nodes;

    banman->ClearBanned();
    NodeId id{0};
    nodes[0] = new CNode{id++,
                         /*sock=*/nullptr,
                         addr[0],
                         /*nKeyedNetGroupIn=*/0,
                         /*nLocalHostNonceIn=*/0,
                         CAddress(),
                         /*addrNameIn=*/"",
                         ConnectionType::INBOUND,
                         /*inbound_onion=*/false};
    nodes[0]->SetCommonVersion(PROTOCOL_VERSION);
    peerLogic->InitializeNode(*nodes[0], NODE_NETWORK);
    nodes[0]->fSuccessfullyConnected = true;
    connman->AddTestNode(*nodes[0]);
    peerLogic->UnitTestMisbehaving(nodes[0]->GetId()); // Should be discouraged
    BOOST_CHECK(peerLogic->SendMessages(nodes[0]));

    BOOST_CHECK(banman->IsDiscouraged(addr[0]));
    BOOST_CHECK(nodes[0]->fDisconnect);
    BOOST_CHECK(!banman->IsDiscouraged(other_addr)); // Different address, not discouraged

    nodes[1] = new CNode{id++,
                         /*sock=*/nullptr,
                         addr[1],
                         /*nKeyedNetGroupIn=*/1,
                         /*nLocalHostNonceIn=*/1,
                         CAddress(),
                         /*addrNameIn=*/"",
                         ConnectionType::INBOUND,
                         /*inbound_onion=*/false};
    nodes[1]->SetCommonVersion(PROTOCOL_VERSION);
    peerLogic->InitializeNode(*nodes[1], NODE_NETWORK);
    nodes[1]->fSuccessfullyConnected = true;
    connman->AddTestNode(*nodes[1]);
    BOOST_CHECK(peerLogic->SendMessages(nodes[1]));
    // [0] is still discouraged/disconnected.
    BOOST_CHECK(banman->IsDiscouraged(addr[0]));
    BOOST_CHECK(nodes[0]->fDisconnect);
    // [1] is not discouraged/disconnected yet.
    BOOST_CHECK(!banman->IsDiscouraged(addr[1]));
    BOOST_CHECK(!nodes[1]->fDisconnect);
    peerLogic->UnitTestMisbehaving(nodes[1]->GetId());
    BOOST_CHECK(peerLogic->SendMessages(nodes[1]));
    // Expect both [0] and [1] to be discouraged/disconnected now.
    BOOST_CHECK(banman->IsDiscouraged(addr[0]));
    BOOST_CHECK(nodes[0]->fDisconnect);
    BOOST_CHECK(banman->IsDiscouraged(addr[1]));
    BOOST_CHECK(nodes[1]->fDisconnect);

    // Make sure non-IP peers are discouraged and disconnected properly.

    nodes[2] = new CNode{id++,
                         /*sock=*/nullptr,
                         addr[2],
                         /*nKeyedNetGroupIn=*/1,
                         /*nLocalHostNonceIn=*/1,
                         CAddress(),
                         /*addrNameIn=*/"",
                         ConnectionType::OUTBOUND_FULL_RELAY,
                         /*inbound_onion=*/false};
    nodes[2]->SetCommonVersion(PROTOCOL_VERSION);
    peerLogic->InitializeNode(*nodes[2], NODE_NETWORK);
    nodes[2]->fSuccessfullyConnected = true;
    connman->AddTestNode(*nodes[2]);
    peerLogic->UnitTestMisbehaving(nodes[2]->GetId());
    BOOST_CHECK(peerLogic->SendMessages(nodes[2]));
    BOOST_CHECK(banman->IsDiscouraged(addr[0]));
    BOOST_CHECK(banman->IsDiscouraged(addr[1]));
    BOOST_CHECK(banman->IsDiscouraged(addr[2]));
    BOOST_CHECK(nodes[0]->fDisconnect);
    BOOST_CHECK(nodes[1]->fDisconnect);
    BOOST_CHECK(nodes[2]->fDisconnect);

    for (CNode* node : nodes) {
        peerLogic->FinalizeNode(*node);
    }
    connman->ClearTestNodes();
}